

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::setToFind
          (const_iterator *this,unsigned_long left,unsigned_long right)

{
  pointer pEVar1;
  ulong uVar2;
  uint uVar3;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *pIVar4;
  ulong uVar5;
  unsigned_long *puVar6;
  ulong *puVar7;
  int iVar8;
  uint32_t offset;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uStack_3c;
  NodeRef NStack_38;
  
  pIVar4 = this->map;
  if (pIVar4->height != 0) {
    uVar3 = this->map->rootSize;
    uVar9 = 0;
    if ((ulong)uVar3 != 0) {
      puVar6 = &(this->map->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                .first[2].right;
      uVar9 = 0;
      do {
        if (left <= *puVar6) goto LAB_0039489b;
        uVar9 = uVar9 + 1;
        puVar6 = puVar6 + 2;
      } while (uVar3 != uVar9);
      uVar9 = (ulong)uVar3;
    }
LAB_0039489b:
    offset = (int)uVar9 - 1;
    if ((int)uVar9 == 0) {
      offset = 0;
    }
    setRoot(this,offset);
    if (((this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len != 0)
       && (pEVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                    data_, pEVar1->offset < pEVar1->size)) {
      iVar8 = (int)(this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   len;
      uVar3 = iVar8 - 1;
      pEVar1 = (this->path).path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
      ;
      NStack_38.pip.value =
           *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
            ((long)pEVar1[uVar3].node + (ulong)pEVar1[uVar3].offset * 8);
      iVar8 = this->map->height - iVar8;
      if (iVar8 != 0) {
        do {
          uVar9 = (ulong)NStack_38.pip.value & 0xffffffffffffffc0;
          uVar3 = SUB84(NStack_38.pip.value,0) & 0x3f;
          iVar11 = uVar3 + 1;
          puVar7 = (ulong *)(uVar9 + 0x40);
          lVar10 = 0;
          do {
            if (left <= *puVar7) {
              iVar11 = (int)lVar10;
              break;
            }
            lVar10 = lVar10 + 1;
            puVar7 = puVar7 + 2;
          } while ((ulong)uVar3 + 1 != lVar10);
          uStack_3c = iVar11 - 1;
          if (iVar11 == 0) {
            uStack_3c = 0;
          }
          uVar2 = (ulong)uStack_3c;
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
          emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,
                     &NStack_38,&uStack_3c);
          NStack_38.pip.value = *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)(uVar9 + uVar2 * 8)
          ;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      puVar7 = (ulong *)((ulong)NStack_38.pip.value & 0xffffffffffffffc0);
      uVar3 = SUB84(NStack_38.pip.value,0) & 0x3f;
      uStack_3c = uVar3 + 1;
      lVar10 = 0;
      do {
        if (left <= *puVar7) {
          uStack_3c = (uint)lVar10;
          break;
        }
        lVar10 = lVar10 + 1;
        puVar7 = puVar7 + 2;
      } while ((ulong)uVar3 + 1 != lVar10);
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)&this->path,&NStack_38,
                 &uStack_3c);
    }
    return;
  }
  uVar5 = (ulong)pIVar4->rootSize;
  uVar2 = 0;
  uVar9 = uVar2;
  if (uVar5 != 0) {
    do {
      uVar9 = uVar2;
      if (left <= (pIVar4->field_0).rootLeaf.
                  super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                  .first[0].left) break;
      uVar2 = uVar2 + 1;
      pIVar4 = (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
               ((pIVar4->field_0).rootLeaf.
                super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_const_slang::ast::Expression_*,_5U>
                .first + 1);
      uVar9 = uVar5;
    } while (uVar5 != uVar2);
  }
  setRoot(this,(uint32_t)uVar9);
  return;
}

Assistant:

bool isFlat() const {
        SLANG_ASSERT(map);
        return map->isFlat();
    }